

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exper.c
# Opt level: O1

int experience(monst *mtmp,int nk)

{
  byte bVar1;
  permonst *ppVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  ppVar2 = mtmp->data;
  bVar1 = mtmp->m_lev;
  iVar3 = find_mac(mtmp);
  lVar5 = 0;
  iVar4 = 7 - iVar3 << (byte)((uint)iVar3 >> 0x1f);
  if (2 < iVar3) {
    iVar4 = 0;
  }
  iVar3 = (uint)('\x12' < ppVar2->mmove) * 2 + 3;
  if (ppVar2->mmove < '\r') {
    iVar3 = 0;
  }
  iVar4 = iVar3 + iVar4 + (uint)bVar1 * (uint)bVar1 + 1;
  do {
    bVar1 = ppVar2->mattk[lVar5].aatyp;
    if (4 < bVar1) {
      if (bVar1 == 0xff) {
        iVar4 = iVar4 + 10;
      }
      else if (bVar1 == 0xfe) {
        iVar4 = iVar4 + 5;
      }
      else {
        iVar4 = iVar4 + 3;
      }
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  lVar5 = 0;
  do {
    bVar1 = ppVar2->mattk[lVar5].adtyp;
    if ((byte)(bVar1 - 1) < 10) {
      uVar6 = (uint)mtmp->m_lev * 2;
    }
    else if ((0x28 < bVar1) ||
            (uVar6 = 0x32, (0x10000048000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) {
      uVar6 = (uint)mtmp->m_lev;
    }
    iVar3 = uVar6 + iVar4;
    if (0x17 < (uint)ppVar2->mattk[lVar5].damn * (uint)ppVar2->mattk[lVar5].damd) {
      iVar3 = iVar3 + (uint)mtmp->m_lev;
    }
    iVar4 = iVar3;
    if ((((bVar1 == 0x1c) && (ppVar2->mlet == '9')) && (u.uprops[0x31].intrinsic == 0)) &&
       ((u.uprops[0x31].extrinsic == 0 &&
        (iVar4 = iVar3 + 1000, ((youmonst.data)->mflags1 & 0x600) != 0)))) {
      iVar4 = iVar3;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  if ((ppVar2->mflags2 & 0x2000000) != 0) {
    iVar4 = iVar4 + ((uint)mtmp->m_lev * 8 - (uint)mtmp->m_lev);
  }
  iVar3 = iVar4 + 0x32;
  if (mtmp->m_lev < 9) {
    iVar3 = iVar4;
  }
  return iVar3;
}

Assistant:

int experience(struct monst *mtmp, int nk)
{
	const struct permonst *ptr = mtmp->data;
	int	i, tmp, tmp2;

	tmp = 1 + mtmp->m_lev * mtmp->m_lev;

/*	For higher ac values, give extra experience */
	if ((i = find_mac(mtmp)) < 3) tmp += (7 - i) * ((i < 0) ? 2 : 1);

/*	For very fast monsters, give extra experience */
	if (ptr->mmove > NORMAL_SPEED)
	    tmp += (ptr->mmove > (3*NORMAL_SPEED/2)) ? 5 : 3;

/*	For each "special" attack type give extra experience */
	for (i = 0; i < NATTK; i++) {

	    tmp2 = ptr->mattk[i].aatyp;
	    if (tmp2 > AT_BUTT) {

		if (tmp2 == AT_WEAP) tmp += 5;
		else if (tmp2 == AT_MAGC) tmp += 10;
		else tmp += 3;
	    }
	}

/*	For each "special" damage type give extra experience */
	for (i = 0; i < NATTK; i++) {
	    tmp2 = ptr->mattk[i].adtyp;
	    if (tmp2 > AD_PHYS && tmp2 < AD_BLND) tmp += 2*mtmp->m_lev;
	    else if ((tmp2 == AD_DRLI) || (tmp2 == AD_STON) ||
	    		(tmp2 == AD_SLIM)) tmp += 50;
	    else if (tmp != AD_PHYS) tmp += mtmp->m_lev;
		/* extra heavy damage bonus */
	    if ((int)(ptr->mattk[i].damd * ptr->mattk[i].damn) > 23)
		tmp += mtmp->m_lev;
	    if (tmp2 == AD_WRAP && ptr->mlet == S_EEL && !Amphibious)
		tmp += 1000;
	}

/*	For certain "extra nasty" monsters, give even more */
	if (extra_nasty(ptr)) tmp += (7 * mtmp->m_lev);

/*	For higher level monsters, an additional bonus is given */
	if (mtmp->m_lev > 8) tmp += 50;

	return tmp;
}